

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_inotify_poller.cc
# Opt level: O2

bool __thiscall NonrecursiveInotifyPoller::AddWatch(NonrecursiveInotifyPoller *this,string *path)

{
  char *__name;
  int iVar1;
  undefined1 local_48 [40];
  
  __name = (path->_M_dataplus)._M_p;
  if (__name[path->_M_string_length - 1] == '/') {
    iVar1 = inotify_add_watch(this->fd_,__name,0x7c2);
    if (-1 < iVar1) {
      local_48._0_4_ = iVar1;
      std::__cxx11::string::string((string *)(local_48 + 8),(string *)path);
      std::
      _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
      ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  *)&this->directories_,
                 (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_48);
      std::__cxx11::string::~string((string *)(local_48 + 8));
    }
    return -1 < iVar1;
  }
  __assert_fail("path[path.size() - 1] == \'/\' && \"Directory names must end with a trailing slash\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                ,0x20,"virtual bool NonrecursiveInotifyPoller::AddWatch(const std::string &)");
}

Assistant:

bool NonrecursiveInotifyPoller::AddWatch(const std::string& path) {
  // Create new inotify watch.
  assert(path[path.size() - 1] == '/' &&
         "Directory names must end with a trailing slash");
  int watch = inotify_add_watch(
      fd_, path.c_str(), IN_CREATE | IN_DELETE | IN_DELETE_SELF | IN_MODIFY |
                             IN_MOVED_FROM | IN_MOVED_TO);
  if (watch < 0)
    return false;

  // Keep track of watch and pathname string, so we can recombine events to
  // full pathname strings.
  directories_.insert({watch, path});
  return true;
}